

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

bool __thiscall tinyusdz::Layer::find_primspec_at(Layer *this,Path *path,PrimSpec **ps,string *err)

{
  Layer *this_00;
  value_type pPVar1;
  ostream *poVar2;
  iterator iVar3;
  value_type *ppPVar4;
  mapped_type *ppPVar5;
  string *args;
  char *pcVar6;
  Layer *pLVar7;
  optional<const_tinyusdz::PrimSpec_*> pv;
  ostringstream ss_e;
  allocator local_211;
  Layer *local_210;
  string local_208;
  optional<const_tinyusdz::PrimSpec_*> local_1e8 [2];
  string local_1c8;
  string local_1a8 [11];
  
  if (ps == (PrimSpec **)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::operator<<(poVar2,"find_primspec_at");
    poVar2 = std::operator<<(poVar2,"():");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x861);
    std::operator<<(poVar2," ");
    pcVar6 = "Invalid PrimSpec dst argument";
  }
  else {
    if (path->_valid != false) {
      if (((path->_prim_part)._M_string_length != 0) &&
         (*(path->_prim_part)._M_dataplus._M_p == '/')) {
        this_00 = this + 0x1580;
        if (this[0x15b0] == (Layer)0x1) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
          ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                   *)this_00);
          this[0x15b0] = (Layer)0x0;
        }
        else {
          iVar3 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                          *)this_00,&path->_prim_part);
          if (iVar3._M_node != (_Base_ptr)(this + 0x1588)) {
            *ps = *(PrimSpec **)(iVar3._M_node + 2);
            return true;
          }
        }
        pLVar7 = this + 0x30;
        local_210 = this_00;
        while( true ) {
          pLVar7 = *(Layer **)pLVar7;
          if (pLVar7 == (Layer *)0x0) {
            return false;
          }
          std::__cxx11::string::string((string *)local_1a8,"",(allocator *)&local_1c8);
          anon_unknown_240::GetPrimSpecAtPathRec
                    (local_1e8,(PrimSpec *)(pLVar7 + 0x28),local_1a8,path,0);
          local_208._M_dataplus._M_p._0_1_ = local_1e8[0].has_value_;
          if (local_1e8[0].has_value_ == true) break;
          std::__cxx11::string::_M_dispose();
        }
        local_208._M_string_length = (size_type)local_1e8[0].contained;
        std::__cxx11::string::_M_dispose();
        ppPVar4 = nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::value
                            ((optional<const_tinyusdz::PrimSpec_*> *)&local_208);
        *ps = *ppPVar4;
        ppPVar4 = nonstd::optional_lite::optional<const_tinyusdz::PrimSpec_*>::value
                            ((optional<const_tinyusdz::PrimSpec_*> *)&local_208);
        pPVar1 = *ppPVar4;
        ppPVar5 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                                *)local_210,&path->_prim_part);
        *ppPVar5 = pPVar1;
        return true;
      }
      args = err;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar2 = std::operator<<((ostream *)local_1a8,"[error]");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                              );
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = std::operator<<(poVar2,"find_primspec_at");
      poVar2 = std::operator<<(poVar2,"():");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x86b);
      std::operator<<(poVar2," ");
      std::__cxx11::string::string((string *)local_1e8,"TODO: Relative path: {}",&local_211);
      Path::full_path_name_abi_cxx11_(&local_1c8,path);
      fmt::format<std::__cxx11::string>(&local_208,(fmt *)local_1e8,&local_1c8,args);
      poVar2 = std::operator<<((ostream *)local_1a8,(string *)&local_208);
      std::operator<<(poVar2,"\n");
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      goto LAB_001223e0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar2 = std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-types.cc"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::operator<<(poVar2,"find_primspec_at");
    poVar2 = std::operator<<(poVar2,"():");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x866);
    std::operator<<(poVar2," ");
    pcVar6 = "Invalid path";
  }
  poVar2 = std::operator<<((ostream *)local_1a8,pcVar6);
  std::operator<<(poVar2,"\n");
LAB_001223e0:
  if (err != (string *)0x0) {
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::append((string *)err);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return false;
}

Assistant:

bool Layer::find_primspec_at(const Path &path, const PrimSpec **ps,
                             std::string *err) const {
  if (!ps) {
    PUSH_ERROR_AND_RETURN("Invalid PrimSpec dst argument");
  }

  if (!path.is_valid()) {
    DCOUT("Invalid path.");
    PUSH_ERROR_AND_RETURN("Invalid path");
  }

  if (path.is_relative_path()) {
    // TODO
    PUSH_ERROR_AND_RETURN(fmt::format("TODO: Relative path: {}", path.full_path_name()));
  }

  if (!path.is_absolute_path()) {
    PUSH_ERROR_AND_RETURN(fmt::format("Path is not absolute path: {}", path.full_path_name()));
  }

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif

  if (_dirty) {
    DCOUT("clear cache.");
    // Clear cache.
    _primspec_path_cache.clear();

    _dirty = false;
  } else {
    // First find from a cache.
    auto ret = _primspec_path_cache.find(path.prim_part());
    if (ret != _primspec_path_cache.end()) {
      DCOUT("Found cache.");
      (*ps) = ret->second;
      return true;
    }
  }

  // Brute-force search.
  for (const auto &parent : _prim_specs) {
    if (auto pv = GetPrimSpecAtPathRec(&parent.second, /* parent_path */ "",
                                       path, /* depth */ 0)) {
      (*ps) = pv.value();

      // Add to cache.
      // Assume pointer address does not change unless dirty state changes.
      _primspec_path_cache[path.prim_part()] = pv.value();
      return true;
    }
  }

  return false;
}